

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O0

ssize_t __thiscall MeshLib::Solid::write(Solid *this,int __fd,void *__buf,size_t __n)

{
  HalfEdge *pHVar1;
  bool bVar2;
  Vertex *this_00;
  Point *this_01;
  double *pdVar3;
  tVertex pVVar4;
  Face *pFVar5;
  HalfEdge **ppHVar6;
  long lVar7;
  ostream *poVar8;
  Vertex **ppVVar9;
  int *piVar10;
  Face **ppFVar11;
  string *psVar12;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  HalfEdge *local_4c0;
  tHalfEdge he_1;
  tFace f_1;
  TreeIterator<MeshLib::Face> pfiter;
  tEdge e;
  TreeIterator<MeshLib::Edge> eiter;
  tHalfEdge he;
  tFace f;
  TreeIterator<MeshLib::Face> fiter;
  int i;
  tVertex v;
  undefined1 local_130 [8];
  TreeIterator<MeshLib::Vertex> viter;
  ostream *os_local;
  Solid *this_local;
  
  viter.m_root = (Node<MeshLib::Vertex> *)CONCAT44(in_register_00000034,__fd);
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator
            ((TreeIterator<MeshLib::Vertex> *)local_130,&this->m_verts);
  while( true ) {
    bVar2 = AVL::TreeIterator<MeshLib::Vertex>::end((TreeIterator<MeshLib::Vertex> *)local_130);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    this_00 = AVL::TreeIterator<MeshLib::Vertex>::operator*
                        ((TreeIterator<MeshLib::Vertex> *)local_130);
    poVar8 = std::operator<<((ostream *)viter.m_root,"Vertex ");
    piVar10 = Vertex::id(this_00);
    std::ostream::operator<<(poVar8,*piVar10);
    for (fiter.m_root._4_4_ = 0; fiter.m_root._4_4_ < 3; fiter.m_root._4_4_ = fiter.m_root._4_4_ + 1
        ) {
      poVar8 = std::operator<<((ostream *)viter.m_root," ");
      this_01 = Vertex::point(this_00);
      pdVar3 = Point::operator[](this_01,fiter.m_root._4_4_);
      std::ostream::operator<<(poVar8,*pdVar3);
    }
    Vertex::string_abi_cxx11_(this_00);
    lVar7 = std::__cxx11::string::size();
    if (lVar7 != 0) {
      poVar8 = std::operator<<((ostream *)viter.m_root," {");
      psVar12 = Vertex::string_abi_cxx11_(this_00);
      poVar8 = std::operator<<(poVar8,(string *)psVar12);
      std::operator<<(poVar8,"}");
    }
    std::ostream::operator<<(viter.m_root,std::endl<char,std::char_traits<char>>);
    AVL::TreeIterator<MeshLib::Vertex>::operator++((TreeIterator<MeshLib::Vertex> *)local_130);
  }
  AVL::TreeIterator<MeshLib::Face>::TreeIterator((TreeIterator<MeshLib::Face> *)&f,&this->m_faces);
  while( true ) {
    bVar2 = AVL::TreeIterator<MeshLib::Face>::end((TreeIterator<MeshLib::Face> *)&f);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pFVar5 = AVL::TreeIterator<MeshLib::Face>::operator*((TreeIterator<MeshLib::Face> *)&f);
    poVar8 = std::operator<<((ostream *)viter.m_root,"Face ");
    piVar10 = Face::id(pFVar5);
    std::ostream::operator<<(poVar8,*piVar10);
    ppHVar6 = Face::halfedge(pFVar5);
    eiter.m_root = (Node<MeshLib::Edge> *)*ppHVar6;
    do {
      poVar8 = std::operator<<((ostream *)viter.m_root," ");
      ppVVar9 = HalfEdge::target((HalfEdge *)eiter.m_root);
      piVar10 = Vertex::id(*ppVVar9);
      std::ostream::operator<<(poVar8,*piVar10);
      ppHVar6 = HalfEdge::he_next((HalfEdge *)eiter.m_root);
      pHVar1 = *ppHVar6;
      eiter.m_root = (Node<MeshLib::Edge> *)pHVar1;
      ppHVar6 = Face::halfedge(pFVar5);
    } while (pHVar1 != *ppHVar6);
    Face::string_abi_cxx11_(pFVar5);
    lVar7 = std::__cxx11::string::size();
    if (lVar7 != 0) {
      poVar8 = std::operator<<((ostream *)viter.m_root," {");
      psVar12 = Face::string_abi_cxx11_(pFVar5);
      poVar8 = std::operator<<(poVar8,(string *)psVar12);
      std::operator<<(poVar8,"}");
    }
    std::ostream::operator<<(viter.m_root,std::endl<char,std::char_traits<char>>);
    AVL::TreeIterator<MeshLib::Face>::operator++((TreeIterator<MeshLib::Face> *)&f);
  }
  AVL::TreeIterator<MeshLib::Face>::~TreeIterator((TreeIterator<MeshLib::Face> *)&f);
  AVL::TreeIterator<MeshLib::Edge>::TreeIterator((TreeIterator<MeshLib::Edge> *)&e,&this->m_edges);
  while( true ) {
    bVar2 = AVL::TreeIterator<MeshLib::Edge>::end((TreeIterator<MeshLib::Edge> *)&e);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pfiter.m_root =
         (Node<MeshLib::Face> *)
         AVL::TreeIterator<MeshLib::Edge>::operator*((TreeIterator<MeshLib::Edge> *)&e);
    Edge::string_abi_cxx11_((Edge *)pfiter.m_root);
    lVar7 = std::__cxx11::string::size();
    if (lVar7 != 0) {
      poVar8 = std::operator<<((ostream *)viter.m_root,"Edge ");
      pVVar4 = edgeVertex1(this,(tEdge)pfiter.m_root);
      piVar10 = Vertex::id(pVVar4);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*piVar10);
      poVar8 = std::operator<<(poVar8," ");
      pVVar4 = edgeVertex2(this,(tEdge)pfiter.m_root);
      piVar10 = Vertex::id(pVVar4);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*piVar10);
      std::operator<<(poVar8," ");
      poVar8 = std::operator<<((ostream *)viter.m_root,"{");
      psVar12 = Edge::string_abi_cxx11_((Edge *)pfiter.m_root);
      poVar8 = std::operator<<(poVar8,(string *)psVar12);
      poVar8 = std::operator<<(poVar8,"}");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
    AVL::TreeIterator<MeshLib::Edge>::operator++((TreeIterator<MeshLib::Edge> *)&e);
  }
  AVL::TreeIterator<MeshLib::Edge>::~TreeIterator((TreeIterator<MeshLib::Edge> *)&e);
  AVL::TreeIterator<MeshLib::Face>::TreeIterator((TreeIterator<MeshLib::Face> *)&f_1,&this->m_faces)
  ;
  while( true ) {
    bVar2 = AVL::TreeIterator<MeshLib::Face>::end((TreeIterator<MeshLib::Face> *)&f_1);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pFVar5 = AVL::TreeIterator<MeshLib::Face>::operator*((TreeIterator<MeshLib::Face> *)&f_1);
    ppHVar6 = Face::halfedge(pFVar5);
    local_4c0 = *ppHVar6;
    do {
      HalfEdge::string_abi_cxx11_(local_4c0);
      lVar7 = std::__cxx11::string::size();
      if (lVar7 != 0) {
        poVar8 = std::operator<<((ostream *)viter.m_root,"Corner ");
        ppVVar9 = HalfEdge::vertex(local_4c0);
        piVar10 = Vertex::id(*ppVVar9);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,*piVar10);
        poVar8 = std::operator<<(poVar8," ");
        ppFVar11 = HalfEdge::face(local_4c0);
        piVar10 = Face::id(*ppFVar11);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,*piVar10);
        std::operator<<(poVar8," ");
        poVar8 = std::operator<<((ostream *)viter.m_root,"{");
        psVar12 = HalfEdge::string_abi_cxx11_(local_4c0);
        poVar8 = std::operator<<(poVar8,(string *)psVar12);
        poVar8 = std::operator<<(poVar8,"}");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      }
      ppHVar6 = HalfEdge::he_next(local_4c0);
      local_4c0 = *ppHVar6;
      ppHVar6 = Face::halfedge(pFVar5);
    } while (local_4c0 != *ppHVar6);
    AVL::TreeIterator<MeshLib::Face>::operator++((TreeIterator<MeshLib::Face> *)&f_1);
  }
  AVL::TreeIterator<MeshLib::Face>::~TreeIterator((TreeIterator<MeshLib::Face> *)&f_1);
  AVL::TreeIterator<MeshLib::Vertex>::~TreeIterator((TreeIterator<MeshLib::Vertex> *)local_130);
  return extraout_RAX;
}

Assistant:

void Solid::write( std::ostream & os ) {
	//remove vertices
	AVL::TreeIterator<Vertex> viter( m_verts );
	for( ; !viter.end() ; ++ viter ) {
		tVertex v = *viter;

		os << "Vertex " << v->id();
		
		for( int i = 0; i < 3; i ++ ) {
			os << " " << v->point()[i];  
		}

		if( v->string().size() > 0 ) {
			os << " {" << v->string() << "}";
		}

		os << std::endl;
	}

	for( AVL::TreeIterator<Face> fiter(m_faces); !fiter.end(); ++ fiter ) {
		tFace f = *fiter;
		os << "Face " << f->id();
		tHalfEdge he = f->halfedge();
		do {
			os << " " << he->target()->id();
			he = he->he_next();
		} while( he != f->halfedge() );

		if( f->string().size() > 0 ) {
			os << " {" << f->string() << "}";
		}

		os << std::endl;
	}


	for( AVL::TreeIterator<Edge> eiter(m_edges); !eiter.end(); ++ eiter ) {
		tEdge e = *eiter;
		if( e->string().size() > 0 ) {
			os << "Edge " << edgeVertex1(e)->id()<< " " << edgeVertex2(e)->id() << " ";
			os << "{" << e->string() << "}" << std::endl;
		}
	}

	for( AVL::TreeIterator<Face> pfiter(m_faces); !pfiter.end(); ++ pfiter ) {
		tFace f = *pfiter;
		tHalfEdge he = f->halfedge();
		do{
			if( he->string().size() > 0 )
			{
				os << "Corner " << he->vertex()->id() << " " << he->face()->id() << " ";
				os <<"{" << he->string() << "}" << std::endl;
			}
			he = he->he_next();
		}while( he != f->halfedge() );
	}


}